

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3GetVarint(char *p,sqlite_int64 *v)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  u64 c;
  int shift;
  u64 b;
  u32 a;
  char *pStart;
  sqlite_int64 *v_local;
  char *p_local;
  int local_4;
  
  uVar2 = (uint)*p;
  if ((uVar2 & 0x80) == 0) {
    *v = (ulong)uVar2;
    local_4 = 1;
  }
  else {
    uVar3 = (int)p[1] << 7;
    if ((uVar3 & 0x4000) == 0) {
      *v = (ulong)(uVar2 & 0x7f | uVar3);
      local_4 = 2;
    }
    else {
      uVar2 = uVar2 & 0x7f | uVar3 & 0x3fff;
      uVar3 = (int)p[2] << 0xe;
      if ((uVar3 & 0x200000) == 0) {
        *v = (ulong)(uVar2 | uVar3);
        local_4 = 3;
      }
      else {
        uVar2 = uVar2 | uVar3 & 0x1fffff;
        uVar3 = (int)p[3] << 0x15;
        if ((uVar3 & 0x10000000) == 0) {
          *v = (ulong)(uVar2 | uVar3);
          local_4 = 4;
        }
        else {
          b = (u64)(uVar2 | uVar3 & 0xfffffff);
          p_local = p + 4;
          for (shift = 0x1c; shift < 0x40; shift = shift + 7) {
            pcVar4 = p_local + 1;
            cVar1 = *p_local;
            b = (((long)cVar1 & 0x7fU) << ((byte)shift & 0x3f)) + b;
            p_local = pcVar4;
            if (((long)cVar1 & 0x80U) == 0) break;
          }
          *v = b;
          local_4 = (int)p_local - (int)p;
        }
      }
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3GetVarint(const char *p, sqlite_int64 *v){
  const char *pStart = p;
  u32 a;
  u64 b;
  int shift;

  GETVARINT_INIT(a, p, 0,  0x00,     0x80, *v, 1);
  GETVARINT_STEP(a, p, 7,  0x7F,     0x4000, *v, 2);
  GETVARINT_STEP(a, p, 14, 0x3FFF,   0x200000, *v, 3);
  GETVARINT_STEP(a, p, 21, 0x1FFFFF, 0x10000000, *v, 4);
  b = (a & 0x0FFFFFFF );

  for(shift=28; shift<=63; shift+=7){
    u64 c = *p++;
    b += (c&0x7F) << shift;
    if( (c & 0x80)==0 ) break;
  }
  *v = b;
  return (int)(p - pStart);
}